

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

Node * __thiscall
mapbox::detail::Earcut<long>::
ObjectPool<mapbox::detail::Earcut<long>::Node,std::allocator<mapbox::detail::Earcut<long>::Node>>::
construct<long,double,double>
          (ObjectPool<mapbox::detail::Earcut<long>::Node,std::allocator<mapbox::detail::Earcut<long>::Node>>
           *this,long *args,double *args_1,double *args_2)

{
  long lVar1;
  Node *pNVar2;
  Node *object;
  double *args_local_2;
  double *args_local_1;
  long *args_local;
  ObjectPool<mapbox::detail::Earcut<long>::Node,_std::allocator<mapbox::detail::Earcut<long>::Node>_>
  *this_local;
  
  if (*(ulong *)(this + 0x10) <= *(ulong *)(this + 8)) {
    pNVar2 = __gnu_cxx::new_allocator<mapbox::detail::Earcut<long>::Node>::allocate
                       ((new_allocator<mapbox::detail::Earcut<long>::Node> *)(this + 0x30),
                        *(size_type *)(this + 0x10),(void *)0x0);
    *(Node **)this = pNVar2;
    std::
    vector<mapbox::detail::Earcut<long>::Node*,std::allocator<mapbox::detail::Earcut<long>::Node*>>
    ::emplace_back<mapbox::detail::Earcut<long>::Node*&>
              ((vector<mapbox::detail::Earcut<long>::Node*,std::allocator<mapbox::detail::Earcut<long>::Node*>>
                *)(this + 0x18),(Node **)this);
    *(undefined8 *)(this + 8) = 0;
  }
  lVar1 = *(long *)(this + 8);
  *(long *)(this + 8) = lVar1 + 1;
  pNVar2 = (Node *)(*(long *)this + lVar1 * 0x48);
  __gnu_cxx::new_allocator<mapbox::detail::Earcut<long>::Node>::
  construct<mapbox::detail::Earcut<long>::Node,long,double,double>
            ((new_allocator<mapbox::detail::Earcut<long>::Node> *)(this + 0x30),pNVar2,args,args_1,
             args_2);
  return pNVar2;
}

Assistant:

T* construct(Args&&... args) {
            if (currentIndex >= blockSize) {
                currentBlock = alloc.allocate(blockSize);
                allocations.emplace_back(currentBlock);
                currentIndex = 0;
            }
            T* object = &currentBlock[currentIndex++];
            alloc.construct(object, std::forward<Args>(args)...);
            return object;
        }